

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

void kratos::decouple_generator_ports(Generator *top)

{
  uint32_t *this;
  size_t *psVar1;
  undefined1 local_c8 [8];
  GeneratorPortVisitor visitor;
  GeneratorStmtCacheVisitor v;
  
  this = &v.super_IRVisitor.level;
  v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  psVar1 = &v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002ae9c8
  ;
  v.super_IRVisitor.visited_._M_h._M_single_bucket._0_1_ = 1;
  v.super_IRVisitor._8_8_ = psVar1;
  IRVisitor::visit_generator_root
            ((IRVisitor *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket,top);
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002a82e0
  ;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)this);
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8 = (undefined1  [8])&PTR_visit_root_002aee88;
  IRVisitor::visit_generator_root((IRVisitor *)local_c8,top);
  v.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  v.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  v.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  v.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  v.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002ae9c8
  ;
  v.super_IRVisitor.visited_._M_h._M_single_bucket._0_1_ = 0;
  v.super_IRVisitor._8_8_ = psVar1;
  IRVisitor::visit_generator_root
            ((IRVisitor *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket,top);
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)&PTR_visit_root_002a82e0
  ;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)this);
  local_c8 = (undefined1  [8])&PTR_visit_root_002a82e0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void decouple_generator_ports(Generator* top) {
    {
        GeneratorStmtCacheVisitor v(true);
        v.visit_generator_root(top);
    }
    GeneratorPortVisitor visitor;
    visitor.visit_generator_root(top);
    {
        GeneratorStmtCacheVisitor v(false);
        v.visit_generator_root(top);
    }
}